

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O0

http_request * parse_request(http_request *__return_storage_ptr__,sub_string *text)

{
  http_request_line local_40;
  undefined1 local_19;
  sub_string *local_18;
  sub_string *text_local;
  http_request *result;
  
  local_19 = 0;
  local_18 = text;
  text_local = (sub_string *)__return_storage_ptr__;
  http_request::http_request(__return_storage_ptr__);
  parse_request_line(&local_40,local_18);
  *(ulong *)((long)&(__return_storage_ptr__->request_line).uri.begin_ + 4) =
       CONCAT44(local_40.uri.end_._0_4_,local_40.uri.begin_._4_4_);
  *(undefined8 *)((long)&(__return_storage_ptr__->request_line).uri.end_ + 4) = local_40._20_8_;
  (__return_storage_ptr__->request_line).method = local_40.method;
  *(undefined4 *)&(__return_storage_ptr__->request_line).field_0x4 = local_40._4_4_;
  (__return_storage_ptr__->request_line).uri.begin_ =
       (char *)CONCAT44(local_40.uri.begin_._4_4_,local_40.uri.begin_._0_4_);
  parse_headers(local_18,&__return_storage_ptr__->headers);
  return __return_storage_ptr__;
}

Assistant:

http_request parse_request(sub_string& text)
{
    http_request result;

    result.request_line = parse_request_line(text);
    parse_headers(text, result.headers);

    return result;
}